

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

int __thiscall
crnlib::static_huffman_data_model::init(static_huffman_data_model *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  uint num_syms;
  uint8 *pCodesizes;
  bool bVar2;
  uint uVar3;
  uint table_bits;
  undefined7 extraout_var;
  decoder_tables *pTables;
  undefined7 extraout_var_00;
  undefined7 uVar4;
  uint uVar5;
  long in_RCX;
  uint in_EDX;
  uint uVar6;
  uint in_R8D;
  ulong uVar7;
  
  this->m_encoding = SUB81(ctx,0);
  vector<unsigned_char>::resize(&this->m_code_sizes,in_EDX,false);
  uVar5 = 0xffffffff;
  uVar3 = 0;
  for (uVar7 = 0; in_EDX != uVar7; uVar7 = uVar7 + 1) {
    bVar1 = *(byte *)(in_RCX + uVar7);
    (this->m_code_sizes).m_p[uVar7] = bVar1;
    uVar6 = (uint)bVar1;
    if (uVar6 <= uVar5) {
      uVar5 = uVar6;
    }
    if (uVar3 <= uVar6) {
      uVar3 = (uint)bVar1;
    }
  }
  uVar6 = 0x10;
  if (in_R8D < 0x10) {
    uVar6 = in_R8D;
  }
  if ((uVar5 <= uVar6 && 0xffffffdf < uVar3 - 0x21) &&
     ((uVar3 <= uVar6 ||
      (bVar2 = prefix_coding::limit_max_code_size(this->m_total_syms,(this->m_code_sizes).m_p,uVar6)
      , bVar2)))) {
    if (this->m_encoding == true) {
      vector<unsigned_short>::resize(&this->m_codes,in_EDX,false);
      if (this->m_pDecode_tables != (decoder_tables *)0x0) {
        crnlib_delete<crnlib::prefix_coding::decoder_tables>(this->m_pDecode_tables);
        this->m_pDecode_tables = (decoder_tables *)0x0;
      }
      bVar2 = prefix_coding::generate_codes
                        (this->m_total_syms,(this->m_code_sizes).m_p,(this->m_codes).m_p);
      uVar4 = extraout_var;
    }
    else {
      vector<unsigned_short>::clear(&this->m_codes);
      pTables = this->m_pDecode_tables;
      if (pTables == (decoder_tables *)0x0) {
        pTables = crnlib_new<crnlib::prefix_coding::decoder_tables>();
        this->m_pDecode_tables = pTables;
      }
      num_syms = this->m_total_syms;
      pCodesizes = (this->m_code_sizes).m_p;
      table_bits = compute_decoder_table_bits(this);
      bVar2 = prefix_coding::generate_decoder_tables(num_syms,pCodesizes,pTables,table_bits);
      uVar4 = extraout_var_00;
    }
    if (bVar2 != false) {
      return (int)CONCAT71(uVar4,1);
    }
  }
  return 0;
}

Assistant:

bool static_huffman_data_model::init(bool encoding, uint total_syms, const uint8* pCode_sizes, uint code_size_limit)
    {
        CRNLIB_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms) && (code_size_limit >= 1));

        m_encoding = encoding;

        code_size_limit = math::minimum(code_size_limit, prefix_coding::cMaxExpectedCodeSize);

        m_code_sizes.resize(total_syms);

        uint min_code_size = UINT_MAX;
        uint max_code_size = 0;

        for (uint i = 0; i < total_syms; i++)
        {
            uint s = pCode_sizes[i];
            m_code_sizes[i] = static_cast<uint8>(s);
            min_code_size = math::minimum(min_code_size, s);
            max_code_size = math::maximum(max_code_size, s);
        }

        if ((max_code_size < 1) || (max_code_size > 32) || (min_code_size > code_size_limit))
        {
            return false;
        }

        if (max_code_size > code_size_limit)
        {
            if (!prefix_coding::limit_max_code_size(m_total_syms, &m_code_sizes[0], code_size_limit))
            {
                return false;
            }
        }

        if (m_encoding)
        {
            m_codes.resize(total_syms);

            if (m_pDecode_tables)
            {
                crnlib_delete(m_pDecode_tables);
                m_pDecode_tables = nullptr;
            }

            if (!prefix_coding::generate_codes(m_total_syms, &m_code_sizes[0], &m_codes[0]))
            {
                return false;
            }
        }
        else
        {
            m_codes.clear();

            if (!m_pDecode_tables)
            {
                m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>();
            }

            if (!prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, compute_decoder_table_bits()))
            {
                return false;
            }
        }

        return true;
    }